

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_hash.h
# Opt level: O0

size_t __thiscall
std::
hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>
::operator()(hash<std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>_>
             *this,reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
                   x)

{
  CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>
  *pCVar1;
  size_t sVar2;
  HashStreamer hs;
  array<int,_0UL> *in_stack_ffffffffffffffb8;
  HashStreamerCombine *in_stack_ffffffffffffffc0;
  HashStreamerCombine local_20;
  reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
  local_8;
  
  mp::HashStreamerCombine::HashStreamerCombine(&local_20,0);
  pCVar1 = reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
           ::get(&local_8);
  mp::CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>::GetArguments
            (&pCVar1->
              super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>);
  hash<std::array<int,_1UL>_>::operator()
            ((hash<std::array<int,_1UL>_> *)in_stack_ffffffffffffffc0,
             (array<int,_1UL> *)in_stack_ffffffffffffffb8);
  mp::HashStreamerCombine::Add<unsigned_long>
            (in_stack_ffffffffffffffc0,(unsigned_long *)in_stack_ffffffffffffffb8);
  pCVar1 = reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
           ::get(&local_8);
  mp::CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>::GetParameters
            (&pCVar1->
              super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>);
  hash<std::array<int,_0UL>_>::operator()
            ((hash<std::array<int,_0UL>_> *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  mp::HashStreamerCombine::Add<unsigned_long>
            (in_stack_ffffffffffffffc0,(unsigned_long *)in_stack_ffffffffffffffb8);
  sVar2 = mp::HashStreamerCombine::FinalizeHashValue(&local_20);
  return sVar2;
}

Assistant:

size_t operator()( std::reference_wrapper<
        const mp::CustomFunctionalConstraint
          <Args, Params, NumOrLogic, Id> > x) const
  {
    mp::HashStreamer hs;
    hs.Add(std::hash<Args>{}(x.get().GetArguments()));
    hs.Add(std::hash<Params>{}(x.get().GetParameters()));
    return hs.FinalizeHashValue();
  }